

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O3

Vector3 __thiscall pm::Rectangle::sample(Rectangle *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  long in_RSI;
  Vector3 VVar5;
  Vector2 sp;
  float local_20;
  float local_1c;
  
  SamplerState::sampleUnitSquare((SamplerState *)&local_20);
  fVar1 = *(float *)(in_RSI + 0x2c);
  fVar2 = *(float *)(in_RSI + 0x20);
  fVar3 = *(float *)(in_RSI + 0x38);
  VVar5.z = (float)*(undefined8 *)(in_RSI + 0x18);
  uVar4 = *(undefined8 *)(in_RSI + 0x30);
  (this->super_Geometry)._vptr_Geometry =
       (_func_int **)
       CONCAT44(local_1c * (float)((ulong)uVar4 >> 0x20) +
                (float)((ulong)*(undefined8 *)(in_RSI + 0x24) >> 0x20) * local_20 +
                (float)((ulong)*(undefined8 *)(in_RSI + 0x18) >> 0x20),
                local_1c * (float)uVar4 + (float)*(undefined8 *)(in_RSI + 0x24) * local_20 + VVar5.z
               );
  (this->super_Geometry).type_ = (Type)(fVar3 * local_1c + fVar1 * local_20 + fVar2);
  VVar5.x = (float)(int)uVar4;
  VVar5.y = (float)(int)((ulong)uVar4 >> 0x20);
  return VVar5;
}

Assistant:

Vector3 Rectangle::sample(void) const
{
	Vector2 sp = samplerState_.sampleUnitSquare();
	return Vector3(point_ + sp.x * a_ + sp.y * b_);
}